

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_setOptionValue(void *highs,char *option,char *value)

{
  HighsStatus HVar1;
  char *in_RDX;
  char *in_RSI;
  string *in_stack_ffffffffffffff00;
  allocator *paVar2;
  string *in_stack_ffffffffffffff08;
  Highs *in_stack_ffffffffffffff10;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [8];
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  Highs *in_stack_ffffffffffffffa8;
  allocator local_39;
  string local_38 [32];
  char *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Highs_setOptionValue",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Highs_setStringOptionValue",&local_71);
  Highs::deprecationMessage
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,local_10,&local_99);
  paVar2 = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,local_18,paVar2);
  HVar1 = Highs::setOptionValue
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return HVar1;
}

Assistant:

HighsInt Highs_setOptionValue(void* highs, const char* option,
                              const char* value) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_setOptionValue",
                           "Highs_setStringOptionValue");
  return (HighsInt)((Highs*)highs)
      ->setOptionValue(std::string(option), std::string(value));
}